

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<288,unsigned_int>
               (hashfunc<unsigned_int> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  size_type sVar2;
  int in_ECX;
  uint in_EDX;
  char *pcVar3;
  uint in_ESI;
  uint32_t in_R8D;
  byte in_R9B;
  bool result;
  keytype k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  undefined2 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8a;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff8b;
  undefined4 uVar5;
  undefined3 uVar6;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar3 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar3 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x120,pcVar3,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12d301);
  Blob<288>::Blob((Blob<288> *)&stack0xffffffffffffffb4);
  memset(&stack0xffffffffffffffb4,0,0x24);
  if ((local_d & 1) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (in_stack_ffffffffffffffb0,
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    uVar5 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_28,0);
    hashfunc<unsigned_int>::operator()
              ((hashfunc<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (void *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,
               (uint32_t *)
               CONCAT44(uVar5,CONCAT13(in_stack_ffffffffffffff8b,
                                       CONCAT12(in_stack_ffffffffffffff8a,in_stack_ffffffffffffff88)
                                      )));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<288>,unsigned_int>
            ((pfHash)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
             SUB41((uint)in_stack_ffffffffffffffa4 >> 0x18,0),(Blob<288> *)CONCAT44(in_ESI,in_EDX),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_ECX,in_R8D));
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28);
  printf("%d keys\n",sVar2 & 0xffffffff);
  uVar6 = (undefined3)in_stack_ffffffffffffffa0;
  bVar4 = 1;
  bVar1 = TestHashList<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                     hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish._7_1_,
                     hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish._6_1_,
                     hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish._5_1_,
                     hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_1_,
                     hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish._3_1_);
  uVar5 = CONCAT13(bVar1 & bVar4,uVar6);
  printf("\n");
  bVar4 = (byte)((uint)uVar5 >> 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,uVar5));
  return (bool)(bVar4 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}